

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O0

string * __thiscall pbrt::MLTSampler::PrimarySample::ToString_abi_cxx11_(PrimarySample *this)

{
  string *in_RDI;
  long *in_stack_00000010;
  float *in_stack_00000018;
  long *in_stack_00000020;
  char *in_stack_00000028;
  
  StringPrintf<long_const&,float_const&,long_const&>
            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010);
  return in_RDI;
}

Assistant:

std::string ToString() const {
            return StringPrintf("[ PrimarySample lastModificationIteration: %d "
                                "valueBackup: %f modifyBackup: %d ]",
                                lastModificationIteration, valueBackup, modifyBackup);
        }